

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmaxheap.c
# Opt level: O0

void zmaxheap_test(void)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  float local_48;
  int res;
  float outfv;
  int32_t outv;
  int i;
  int maxi;
  int maxv;
  float fv;
  int32_t v;
  int iter;
  int zcnt;
  int maxsz;
  zmaxheap_t *heap;
  int32_t *vals;
  int sz;
  int cap;
  
  vals._4_4_ = 10000;
  vals._0_4_ = 0;
  heap = (zmaxheap_t *)calloc(4,10000);
  _zcnt = zmaxheap_create(4);
  iter = 0;
  v = 0;
  fv = 0.0;
  while( true ) {
    if (4999999 < (int)fv) {
      printf("max size: %d, zcount %d\n",(ulong)(uint)iter,(ulong)(uint)v);
      free(heap);
      return;
    }
    if ((int)vals != _zcnt->size) break;
    uVar2 = random();
    if (((uVar2 & 1) == 0) && ((int)vals < vals._4_4_)) {
      lVar3 = random();
      maxv = (int)(lVar3 / 1000);
      maxi = (int)(float)maxv;
      if (NAN((float)maxv) || NAN((float)maxi)) {
        __assert_fail("v == fv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                      ,0x172,"void zmaxheap_test()");
      }
      *(int *)((long)&heap->el_sz + (long)(int)vals * 4) = maxv;
      zmaxheap_add(_zcnt,&maxv,(float)maxi);
      vals._0_4_ = (int)vals + 1;
    }
    else {
      i = -1;
      outv = -1;
      for (outfv = 0.0; (int)outfv < (int)vals; outfv = (float)((int)outfv + 1)) {
        if (i < *(int *)((long)&heap->el_sz + (long)(int)outfv * 4)) {
          i = *(int *)((long)&heap->el_sz + (long)(int)outfv * 4);
          outv = (int32_t)outfv;
        }
      }
      iVar1 = zmaxheap_remove_max(_zcnt,&res,&local_48);
      if ((int)vals == 0) {
        if (iVar1 != 0) {
          __assert_fail("res == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                        ,0x189,"void zmaxheap_test()");
        }
      }
      else {
        if (((float)res != local_48) || (NAN((float)res) || NAN(local_48))) {
          __assert_fail("outv == outfv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                        ,0x18c,"void zmaxheap_test()");
        }
        if (i != res) {
          __assert_fail("maxv == outv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                        ,0x18d,"void zmaxheap_test()");
        }
        *(undefined4 *)((long)&heap->el_sz + (long)outv * 4) =
             *(undefined4 *)((long)&heap->el_sz + (long)((int)vals + -1) * 4);
        vals._0_4_ = (int)vals + -1;
      }
    }
    if (iter < (int)vals) {
      iter = (int)vals;
    }
    if ((0 < iter) && ((int)vals == 0)) {
      v = v + 1;
    }
    fv = (float)((int)fv + 1);
  }
  __assert_fail("sz == heap->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zmaxheap.c"
                ,0x16c,"void zmaxheap_test()");
}

Assistant:

void zmaxheap_test()
{
    int cap = 10000;
    int sz = 0;
    int32_t *vals = calloc(sizeof(int32_t), cap);

    zmaxheap_t *heap = zmaxheap_create(sizeof(int32_t));

    int maxsz = 0;
    int zcnt = 0;

    for (int iter = 0; iter < 5000000; iter++) {
        assert(sz == heap->size);

        if ((random() & 1) == 0 && sz < cap) {
            // add a value
            int32_t v = (int32_t) (random() / 1000);
            float fv = v;
            assert(v == fv);

            vals[sz] = v;
            zmaxheap_add(heap, &v, fv);
            sz++;

//            printf("add %d %f\n", v, fv);
        } else {
            // remove a value
            int maxv = -1, maxi = -1;

            for (int i = 0; i < sz; i++) {
                if (vals[i] > maxv) {
                    maxv = vals[i];
                    maxi = i;
                }
            }


            int32_t outv;
            float outfv;
            int res = zmaxheap_remove_max(heap, &outv, &outfv);
            if (sz == 0) {
                assert(res == 0);
            } else {
//                printf("%d %d %d %f\n", sz, maxv, outv, outfv);
                assert(outv == outfv);
                assert(maxv == outv);

                // shuffle erase the maximum from our list.
                vals[maxi] = vals[sz - 1];
                sz--;
            }
        }

        if (sz > maxsz)
            maxsz = sz;

        if (maxsz > 0 && sz == 0)
            zcnt++;
    }

    printf("max size: %d, zcount %d\n", maxsz, zcnt);
    free (vals);
}